

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O0

SW_FT_Error ft_stroker_inside(SW_FT_Stroker stroker,SW_FT_Int side,SW_FT_Fixed line_length)

{
  SW_FT_Error SVar1;
  SW_FT_Angle SVar2;
  SW_FT_Long x;
  SW_FT_Vector *to;
  SW_FT_StrokeBorder border_00;
  long in_RDX;
  int in_ESI;
  SW_FT_Angle *in_RDI;
  SW_FT_Fixed min_length;
  SW_FT_Bool intersect;
  SW_FT_Error error;
  SW_FT_Vector delta;
  SW_FT_Vector sigma;
  SW_FT_Fixed length;
  SW_FT_Angle rotate;
  SW_FT_Angle theta;
  SW_FT_Angle phi;
  SW_FT_StrokeBorder border;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  SW_FT_Vector *in_stack_ffffffffffffff90;
  bool local_65;
  SW_FT_Bool movable;
  long in_stack_ffffffffffffffa0;
  long in_stack_ffffffffffffffa8;
  SW_FT_Long local_50;
  SW_FT_Long local_48;
  
  movable = '\0';
  SVar2 = SW_FT_Angle_Diff(*in_RDI,in_RDI[1]);
  if (((((char)in_RDI[(long)in_ESI * 5 + 0x11] == '\0') || (in_RDX == 0)) || (0x59c000 < SVar2 / 2))
     || (SVar2 / 2 < -0x59c000)) {
    local_65 = false;
  }
  else {
    SW_FT_Vector_Unit(in_stack_ffffffffffffff90,
                      CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    x = SW_FT_MulDiv(in_RDI[0xd],local_48,local_50);
    in_stack_ffffffffffffff90 = (SW_FT_Vector *)ft_pos_abs(x);
    in_stack_ffffffffffffff8f = false;
    local_65 = (bool)in_stack_ffffffffffffff8f;
    if ((in_stack_ffffffffffffff90 != (SW_FT_Vector *)0x0) &&
       (in_stack_ffffffffffffff8f = false, local_65 = (bool)in_stack_ffffffffffffff8f,
       (long)in_stack_ffffffffffffff90 <= in_RDI[4])) {
      in_stack_ffffffffffffff8f = (long)in_stack_ffffffffffffff90 <= in_RDX;
      local_65 = (bool)in_stack_ffffffffffffff8f;
    }
  }
  if (local_65 == false) {
    SW_FT_Vector_From_Polar
              (in_stack_ffffffffffffff90,
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),0x10f0ed);
    to = (SW_FT_Vector *)(in_RDI[2] + in_stack_ffffffffffffffa0);
    border_00 = (SW_FT_StrokeBorder)(in_RDI[3] + in_stack_ffffffffffffffa8);
    *(undefined1 *)(in_RDI + (long)in_ESI * 5 + 0x11) = 0;
  }
  else {
    SW_FT_DivFix(in_RDI[0xd],local_50);
    SW_FT_Vector_From_Polar
              (in_stack_ffffffffffffff90,
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),0x10f161);
    to = (SW_FT_Vector *)(in_RDI[2] + in_stack_ffffffffffffffa0);
    border_00 = (SW_FT_StrokeBorder)(in_RDI[3] + in_stack_ffffffffffffffa8);
  }
  SVar1 = ft_stroke_border_lineto(border_00,to,movable);
  return SVar1;
}

Assistant:

static SW_FT_Error ft_stroker_inside(SW_FT_Stroker stroker, SW_FT_Int side,
                                     SW_FT_Fixed line_length)
{
    SW_FT_StrokeBorder border = stroker->borders + side;
    SW_FT_Angle        phi, theta, rotate;
    SW_FT_Fixed        length;
    SW_FT_Vector       sigma, delta;
    SW_FT_Error        error = 0;
    SW_FT_Bool         intersect; /* use intersection of lines? */

    rotate = SW_FT_SIDE_TO_ROTATE(side);

    theta = SW_FT_Angle_Diff(stroker->angle_in, stroker->angle_out) / 2;

    /* Only intersect borders if between two lineto's and both */
    /* lines are long enough (line_length is zero for curves). */
    if (!border->movable || line_length == 0  ||
         theta > 0x59C000 || theta < -0x59C000 )
        intersect = FALSE;
    else {
      /* compute minimum required length of lines */
      SW_FT_Fixed  min_length;


      SW_FT_Vector_Unit( &sigma, theta );
      min_length =
        ft_pos_abs( SW_FT_MulDiv( stroker->radius, sigma.y, sigma.x ) );

      intersect = SW_FT_BOOL( min_length                         &&
                           stroker->line_length >= min_length &&
                           line_length          >= min_length );
    }

    if (!intersect) {
        SW_FT_Vector_From_Polar(&delta, stroker->radius,
                                stroker->angle_out + rotate);
        delta.x += stroker->center.x;
        delta.y += stroker->center.y;

        border->movable = FALSE;
    } else {
        /* compute median angle */
        phi = stroker->angle_in + theta + rotate;

      length = SW_FT_DivFix( stroker->radius, sigma.x );

      SW_FT_Vector_From_Polar( &delta, length, phi );
      delta.x += stroker->center.x;
      delta.y += stroker->center.y;
    }

    error = ft_stroke_border_lineto(border, &delta, FALSE);

    return error;
}